

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::index_check(CVmObjLookupTable *this,vm_val_t *result,vm_val_t *idx)

{
  undefined4 uVar1;
  vm_lookup_val *pvVar2;
  vm_val_t *in_RSI;
  vm_lookup_val *entry;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pvVar2 = find_entry((CVmObjLookupTable *)result,idx,(uint *)entry,
                      (vm_lookup_val **)
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (pvVar2 == (vm_lookup_val *)0x0) {
    vm_val_t::set_nil(in_RSI);
  }
  else {
    uVar1 = *(undefined4 *)&(pvVar2->val).field_0x4;
    in_RSI->typ = (pvVar2->val).typ;
    *(undefined4 *)&in_RSI->field_0x4 = uVar1;
    in_RSI->val = (pvVar2->val).val;
  }
  return (uint)(pvVar2 != (vm_lookup_val *)0x0);
}

Assistant:

int CVmObjLookupTable::index_check(VMG_ vm_val_t *result, const vm_val_t *idx)
{
    /* find the entry */
    vm_lookup_val *entry = find_entry(vmg_ idx, 0, 0);

    /* if we found it, return it; otherwise, return nil */
    if (entry != 0)
    {
        /* get the indexed value */
        *result = entry->val;

        /* indicate that the key is present is in the table */
        return TRUE;
    }
    else
    {
        /* 
         *   not found - set a nil result value and indicate that the key
         *   isn't in the table 
         */
        result->set_nil();
        return FALSE;
    }
}